

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.cpp
# Opt level: O0

void scale_interval(uint *I_start,uint *I_end,int *I_l,int *I_bar_l,int n_int,int scale)

{
  long in_RCX;
  long in_RDX;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar1;
  int i;
  int local_2c;
  
  *in_RDI = 0;
  *in_RSI = 0;
  for (local_2c = 1; local_2c <= in_R8D; local_2c = local_2c + 1) {
    dVar1 = floor((double)*(int *)(in_RCX + (long)local_2c * 4) / (double)in_R9D);
    *(int *)(in_RCX + (long)local_2c * 4) = (int)dVar1;
    dVar1 = ceil((double)*(int *)(in_RDX + (long)local_2c * 4) / (double)in_R9D);
    *(int *)(in_RDX + (long)local_2c * 4) = (int)dVar1;
    in_RDI[local_2c] = *(int *)(in_RCX + (long)local_2c * 4) + in_RSI[local_2c + -1];
    in_RSI[local_2c] = in_RDI[local_2c] + *(int *)(in_RDX + (long)local_2c * 4);
  }
  return;
}

Assistant:

void scale_interval(unsigned int* I_start, unsigned int* I_end, int* I_l, int* I_bar_l, int n_int, int scale)
{
    I_start[0] = 0;
    I_end[0] = 0;

    for(int i=1; i<=n_int; i++)
    {
        I_bar_l[i] = floor(double(I_bar_l[i]) / scale);
        I_l[i] = ceil(double(I_l[i]) / scale);
        I_start[i] = I_bar_l[i] + I_end[i-1];
        I_end[i] = I_start[i] + I_l[i];
    }
}